

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall Js::ByteCodeWriter::Data::Create(Data *this,uint initSize,ArenaAllocator *tmpAlloc)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DataChunk *this_00;
  
  this->tempAllocator = tmpAlloc;
  if (this->head != (DataChunk *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xcdd,"(head == nullptr)","Missing dispose?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    tmpAlloc = this->tempAllocator;
  }
  this->currentOffset = 0;
  this_00 = (DataChunk *)new<Memory::ArenaAllocator>(0x20,tmpAlloc,0x364470);
  DataChunk::DataChunk(this_00,this->tempAllocator,initSize);
  this->head = this_00;
  this->current = this_00;
  return;
}

Assistant:

void ByteCodeWriter::Data::Create(uint initSize, ArenaAllocator* tmpAlloc)
    {
        //
        // Allocate the initial byte-code block to write into.
        //

        tempAllocator = tmpAlloc;
        AssertMsg(head == nullptr, "Missing dispose?");
        currentOffset = 0;
        head = Anew(tempAllocator, DataChunk, tempAllocator, initSize);
        current = head;
    }